

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.cpp
# Opt level: O0

void __thiscall ast_compound_statement::print(ast_compound_statement *this)

{
  bool bVar1;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_18;
  ast_node *ast;
  ast_compound_statement *this_local;
  
  printf("{\n");
  bVar1 = ::exec_node_is_tail_sentinel((this->statements).head_sentinel.next);
  if (bVar1) {
    local_28 = (undefined8 *)0x0;
  }
  else {
    local_28 = (undefined8 *)
               ((long)(this->statements).head_sentinel.next -
               ((long)(this->statements).head_sentinel.next +
               (0x28 - (long)(this->statements).head_sentinel.next)));
  }
  local_18 = local_28;
  while (local_18 != (undefined8 *)0x0) {
    (**(code **)*local_18)();
    bVar1 = ::exec_node_is_tail_sentinel((exec_node *)local_18[5]);
    if (bVar1) {
      local_30 = (undefined8 *)0x0;
    }
    else {
      local_30 = (undefined8 *)(local_18[5] - ((local_18[5] + 0x28) - local_18[5]));
    }
    local_18 = local_30;
  }
  printf("}\n");
  return;
}

Assistant:

void
ast_compound_statement::print(void) const
{
   printf("{\n");

   foreach_list_typed(ast_node, ast, link, &this->statements) {
      ast->print();
   }

   printf("}\n");
}